

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

void quantize_row_iq3_xxs_impl(int grid_size,float *x,void *vy,int64_t n,float *quant_weights)

{
  uint32_t uVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  undefined1 auVar13 [15];
  undefined1 auVar14 [14];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  unkuint9 Var21;
  undefined1 auVar22 [11];
  undefined1 auVar23 [13];
  undefined1 auVar24 [14];
  undefined1 auVar25 [12];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  uint6 uVar28;
  uint32_t *grid;
  int *piVar29;
  undefined8 *puVar30;
  int i;
  uint uVar31;
  long lVar32;
  float *pfVar33;
  long lVar34;
  ulong uVar35;
  ushort uVar36;
  char *pcVar37;
  int i_1;
  long lVar38;
  char *pcVar39;
  float *pfVar40;
  undefined4 in_register_0000003c;
  long lVar41;
  byte bVar42;
  byte bVar43;
  int iVar44;
  int i_4;
  ulong uVar45;
  int is;
  int k_1;
  long lVar46;
  int8_t *L_00;
  short sVar47;
  anon_union_4_2_5fd15f10 fp32;
  float fVar48;
  float fVar49;
  float fVar51;
  float fVar53;
  int iVar54;
  float fVar55;
  int iVar56;
  float fVar57;
  int iVar58;
  undefined1 uVar65;
  undefined1 uVar66;
  anon_union_4_2_5fd15f10 fp32_2;
  undefined1 auVar59 [15];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  ushort uVar73;
  float fVar74;
  uint uVar75;
  ushort uVar85;
  ushort uVar87;
  ushort uVar89;
  undefined1 auVar76 [12];
  ushort uVar93;
  undefined1 auVar77 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  ushort uVar83;
  ushort uVar84;
  ushort uVar86;
  ushort uVar88;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  undefined1 auVar82 [16];
  undefined1 auVar97 [16];
  uint8_t block_signs [8];
  _Bool is_on_grid [8];
  _Bool is_on_grid_aux [8];
  int8_t L [32];
  int8_t Laux [32];
  uint8_t q3 [104];
  float scales [8];
  float xval [32];
  float weight [32];
  float waux [32];
  long local_350;
  uint local_348 [2];
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  uint16_t *local_320;
  undefined8 local_318;
  float local_310;
  float local_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  long local_2e0;
  long local_2d8;
  float *local_2d0;
  undefined8 *local_2c8;
  undefined8 local_2c0;
  long local_2b8;
  undefined8 local_2b0;
  int64_t local_2a8;
  long local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  uint local_248 [12];
  float local_218 [4];
  uint local_208 [12];
  float afStack_1d8 [8];
  float local_1b8 [98];
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar50;
  undefined6 uVar52;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  
  piVar29 = iq3_data[0].map;
  grid = iq3_data[0].grid;
  lVar38 = CONCAT44(in_register_0000003c,grid_size);
  local_2e0 = lVar38;
  if (iq3_data[0].grid == (uint32_t *)0x0) {
    pcVar39 = "kgrid_q3xs && \"forgot to call ggml_quantize_init()?\"";
    iVar44 = 0xde6;
  }
  else if (iq3_data[0].map == (int *)0x0) {
    pcVar39 = "kmap_q3xs && \"forgot to call ggml_quantize_init()?\"";
    iVar44 = 0xde7;
  }
  else {
    local_320 = iq3_data[0].neighbours;
    if (iq3_data[0].neighbours == (uint16_t *)0x0) {
      pcVar39 = "kneighbors_q3xs && \"forgot to call ggml_quantize_init()?\"";
      iVar44 = 0xde8;
    }
    else {
      if ((char)vy == '\0') {
        lVar46 = (long)vy >> 8;
        if (0 < lVar46) {
          local_2c8 = (undefined8 *)((long)x + 2);
          local_320 = iq3_data[0].neighbours + -1;
          local_2c0 = local_318;
          local_328 = 0;
          auVar72 = _DAT_0014a080;
          auVar70 = _DAT_0014e7c0;
          auVar97 = _DAT_0014e740;
          auVar63 = _DAT_0014e990;
          auVar64 = _DAT_0014e710;
          auVar71 = _DAT_0014e690;
          local_338 = lVar46;
          local_2d8 = n;
          local_2a8 = n;
          do {
            *(ushort *)x = 0;
            local_208[4] = 0;
            local_208[5] = 0;
            local_208[6] = 0;
            local_208[7] = 0;
            local_208[0] = 0;
            local_208[1] = 0;
            local_208[2] = 0;
            local_208[3] = 0;
            local_218[0] = 0.0;
            local_218[1] = 0.0;
            local_218[2] = 0.0;
            local_218[3] = 0.0;
            local_248[8] = 0;
            local_248[9] = 0;
            local_248[10] = 0;
            local_248[0xb] = 0;
            local_248[4] = 0;
            local_248[5] = 0;
            local_248[6] = 0;
            local_248[7] = 0;
            local_248[0] = 0;
            local_248[1] = 0;
            local_248[2] = 0;
            local_248[3] = 0;
            local_208[8] = 0;
            local_208[9] = 0;
            local_2a0 = local_328 * 0x400 + local_2e0;
            lVar32 = 0;
            fVar74 = 0.0;
            do {
              fVar48 = *(float *)(lVar38 + lVar32 * 4);
              fVar74 = fVar74 + fVar48 * fVar48;
              lVar32 = lVar32 + 1;
            } while (lVar32 != 0x100);
            local_310 = (fVar74 + fVar74) * 0.00390625;
            auVar82 = ZEXT416(0);
            local_2b8 = local_2d8;
            local_350 = 0;
            local_340 = lVar38;
            local_330 = lVar38;
            local_2d0 = x;
            do {
              uVar75 = auVar82._0_4_;
              if (n == 0) {
                lVar38 = 0;
                do {
                  pfVar33 = (float *)(local_340 + lVar38 * 4);
                  fVar74 = pfVar33[1];
                  fVar48 = pfVar33[2];
                  fVar51 = pfVar33[3];
                  local_1b8[lVar38 + 0x20] = *pfVar33 * *pfVar33;
                  local_1b8[lVar38 + 0x21] = fVar74 * fVar74;
                  local_1b8[lVar38 + 0x22] = fVar48 * fVar48;
                  local_1b8[lVar38 + 0x23] = fVar51 * fVar51;
                  lVar38 = lVar38 + 4;
                } while (lVar38 != 0x20);
              }
              else {
                lVar38 = 0;
                do {
                  fVar74 = *(float *)(local_2b8 + lVar38 * 4);
                  fVar48 = *(float *)(local_340 + lVar38 * 4);
                  fVar48 = fVar48 * fVar48 + local_310;
                  if (fVar48 < 0.0) {
                    local_2f8 = fVar74;
                    fVar48 = sqrtf(fVar48);
                    auVar82 = ZEXT416(uVar75);
                    auVar72 = _DAT_0014a080;
                    auVar70 = _DAT_0014e7c0;
                    auVar97 = _DAT_0014e740;
                    auVar63 = _DAT_0014e990;
                    auVar64 = _DAT_0014e710;
                    auVar71 = _DAT_0014e690;
                    fVar74 = local_2f8;
                  }
                  else {
                    fVar48 = SQRT(fVar48);
                  }
                  local_1b8[lVar38 + 0x20] = fVar74 * fVar48;
                  lVar38 = lVar38 + 1;
                } while (lVar38 != 0x20);
              }
              lVar32 = local_350 * 0x80 + local_2a0;
              lVar38 = 0;
              do {
                fVar74 = local_1b8[lVar38 + 0x20];
                if (fVar74 < 0.0) {
                  fVar74 = sqrtf(fVar74);
                  auVar82 = ZEXT416(uVar75);
                  auVar72 = _DAT_0014a080;
                  auVar70 = _DAT_0014e7c0;
                  auVar97 = _DAT_0014e740;
                  auVar63 = _DAT_0014e990;
                  auVar64 = _DAT_0014e710;
                  auVar71 = _DAT_0014e690;
                }
                else {
                  fVar74 = SQRT(fVar74);
                }
                local_1b8[lVar38 + 0x40] = fVar74;
                lVar38 = lVar38 + 1;
              } while (lVar38 != 0x20);
              pfVar33 = local_1b8 + 0x20;
              pfVar40 = local_1b8;
              lVar41 = 0;
              lVar38 = local_340;
              do {
                lVar34 = 0;
                bVar43 = 0;
                bVar42 = 0;
                do {
                  fVar74 = *(float *)(lVar38 + lVar34 * 4);
                  if (0.0 <= fVar74) {
                    pfVar40[lVar34] = fVar74;
                  }
                  else {
                    pfVar40[lVar34] = (float)((uint)fVar74 ^ auVar72._0_4_);
                    bVar43 = bVar43 + 1;
                    bVar42 = bVar42 | (byte)(1 << ((byte)lVar34 & 0x1f));
                  }
                  lVar34 = lVar34 + 1;
                } while (lVar34 != 8);
                if ((bool)(bVar43 & 1)) {
                  fVar74 = *(float *)(lVar32 + lVar41 * 0x20);
                  fVar74 = local_1b8[lVar41 * 8 + 0x20] * fVar74 * fVar74;
                  uVar35 = 0;
                  uVar45 = 1;
                  do {
                    fVar48 = *(float *)(lVar38 + uVar45 * 4);
                    fVar48 = pfVar33[uVar45] * fVar48 * fVar48;
                    if (fVar48 < fVar74) {
                      uVar35 = uVar45 & 0xffffffff;
                      fVar74 = fVar48;
                    }
                    uVar45 = uVar45 + 1;
                  } while (uVar45 != 8);
                  iVar44 = (int)lVar41 * 8 + (int)uVar35;
                  local_1b8[iVar44] = (float)((uint)local_1b8[iVar44] ^ (uint)DAT_0014a080);
                  bVar42 = bVar42 ^ (byte)(1 << ((byte)uVar35 & 0x1f));
                  auVar72 = _DAT_0014a080;
                  auVar70 = _DAT_0014e7c0;
                }
                *(byte *)((long)local_348 + lVar41) = bVar42 & 0x7f;
                lVar41 = lVar41 + 1;
                pfVar40 = pfVar40 + 8;
                lVar38 = lVar38 + 0x20;
                pfVar33 = pfVar33 + 8;
              } while (lVar41 != 4);
              lVar38 = 1;
              fVar74 = local_1b8[0];
              do {
                if (fVar74 <= local_1b8[lVar38]) {
                  fVar74 = local_1b8[lVar38];
                }
                lVar38 = lVar38 + 1;
              } while (lVar38 != 0x20);
              if (1e-08 <= fVar74) {
                _local_308 = ZEXT416((uint)(fVar74 / 15.0));
                _local_278 = ZEXT812(0);
                fStack_26c = 0.0;
                iVar44 = -0xf;
                do {
                  fVar48 = ((float)iVar44 * 0.2 + 15.0) / fVar74;
                  local_30c = 1.0 / fVar48;
                  pcVar39 = (char *)&local_268;
                  lVar38 = 0;
                  fVar51 = fVar48;
                  fVar55 = fVar48;
                  fVar57 = fVar48;
                  local_2f8 = fVar48;
                  fStack_2f4 = fVar48;
                  fStack_2f0 = fVar48;
                  fStack_2ec = fVar48;
                  do {
                    fVar49 = (local_1b8[lVar38 * 4] * fVar48 + -1.0) * 0.5 + 12582912.0;
                    fVar53 = (local_1b8[lVar38 * 4 + 1] * fVar51 + -1.0) * 0.5 + 12582912.0;
                    auVar72._0_8_ = CONCAT44(fVar53,fVar49) & 0x7fffff007fffff;
                    auVar72._8_4_ =
                         (uint)((local_1b8[lVar38 * 4 + 2] * fVar55 + -1.0) * 0.5 + 12582912.0) &
                         0x7fffff;
                    auVar72._12_4_ =
                         (uint)((local_1b8[lVar38 * 4 + 3] * fVar57 + -1.0) * 0.5 + 12582912.0) &
                         0x7fffff;
                    auVar60._0_4_ = -(uint)((int)((uint)fVar49 & 0x7fffff) < auVar63._0_4_);
                    auVar60._4_4_ = -(uint)((int)((uint)fVar53 & 0x7fffff) < auVar63._4_4_);
                    auVar60._8_4_ = -(uint)((int)auVar72._8_4_ < auVar63._8_4_);
                    auVar60._12_4_ = -(uint)((int)auVar72._12_4_ < auVar63._12_4_);
                    auVar72 = ~auVar60 & auVar63 | auVar72 & auVar60;
                    auVar70._0_4_ = -(uint)(auVar97._0_4_ < auVar72._0_4_);
                    auVar70._4_4_ = -(uint)(auVar97._4_4_ < auVar72._4_4_);
                    auVar70._8_4_ = -(uint)(auVar97._8_4_ < auVar72._8_4_);
                    auVar70._12_4_ = -(uint)(auVar97._12_4_ < auVar72._12_4_);
                    auVar72 = auVar70 & auVar72 & auVar64;
                    sVar6 = auVar72._0_2_;
                    cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar72[0] - (0xff < sVar6);
                    sVar6 = auVar72._2_2_;
                    sVar47 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar72[2] - (0xff < sVar6),
                                      cVar2);
                    sVar6 = auVar72._4_2_;
                    cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar72[4] - (0xff < sVar6);
                    sVar6 = auVar72._6_2_;
                    uVar50 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar72[6] - (0xff < sVar6),
                                      CONCAT12(cVar3,sVar47));
                    sVar6 = auVar72._8_2_;
                    cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar72[8] - (0xff < sVar6);
                    sVar6 = auVar72._10_2_;
                    uVar52 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar72[10] - (0xff < sVar6),
                                      CONCAT14(cVar4,uVar50));
                    sVar6 = auVar72._12_2_;
                    cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar72[0xc] - (0xff < sVar6);
                    sVar8 = auVar72._14_2_;
                    sVar6 = (short)((uint)uVar50 >> 0x10);
                    sVar7 = (short)((uint6)uVar52 >> 0x20);
                    sVar8 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar72[0xe] -
                                             (0xff < sVar8),CONCAT16(cVar5,uVar52)) >> 0x30);
                    *(uint *)((long)&local_268 + lVar38 * 4) =
                         CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                                  CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                           CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 -
                                                    (0xff < sVar6),
                                                    (0 < sVar47) * (sVar47 < 0x100) * cVar2 -
                                                    (0xff < sVar47))));
                    lVar46 = 0;
                    uVar35 = 0;
                    pcVar37 = pcVar39;
                    do {
                      uVar35 = (ulong)((uint)uVar35 | (int)*pcVar37 << ((byte)lVar46 & 0x1f));
                      lVar46 = lVar46 + 3;
                      pcVar37 = pcVar37 + 1;
                    } while (lVar46 != 0xc);
                    iVar54 = piVar29[uVar35 & 0xffff];
                    *(undefined1 *)((long)&local_2b0 + lVar38) = 1;
                    if ((long)iVar54 < 0) {
                      *(undefined1 *)((long)&local_2b0 + lVar38) = 0;
                      iq3_find_best_neighbour
                                (local_320 + -(long)iVar54,grid,local_1b8 + lVar38 * 4,
                                 local_1b8 + lVar38 * 4 + 0x40,local_30c,
                                 (int8_t *)((long)&local_268 + lVar38 * 4));
                      auVar82 = ZEXT416(uVar75);
                      auVar97 = _DAT_0014e740;
                      auVar63 = _DAT_0014e990;
                      auVar64 = _DAT_0014e710;
                      auVar71 = _DAT_0014e690;
                      fVar48 = local_2f8;
                      fVar51 = fStack_2f4;
                      fVar55 = fStack_2f0;
                      fVar57 = fStack_2ec;
                    }
                    lVar38 = lVar38 + 1;
                    pcVar39 = pcVar39 + 4;
                  } while (lVar38 != 8);
                  fVar48 = 0.0;
                  fVar51 = 0.0;
                  fVar55 = 0.0;
                  fVar57 = 0.0;
                  lVar38 = 0;
                  do {
                    fVar53 = (float)(*(char *)((long)&local_268 + lVar38) * 2 + 1);
                    fVar49 = local_1b8[lVar38 + 0x20];
                    fVar48 = fVar48 + fVar53 * local_1b8[lVar38] * fVar49;
                    fVar51 = fVar51 + fVar53 * fVar53 * fVar49;
                    fVar55 = fVar55 + fVar53 * fVar49 * 0.0;
                    fVar57 = fVar57 + fVar53 * fVar49 * 0.0;
                    lVar38 = lVar38 + 1;
                  } while (lVar38 != 0x20);
                  if ((0.0 < fVar51) && ((float)local_278._0_4_ * fVar51 < fVar48 * fVar48)) {
                    local_288 = local_258;
                    uStack_280 = uStack_250;
                    local_298 = local_268;
                    uStack_290 = uStack_260;
                    local_2c0 = local_2b0;
                    local_308._4_4_ = fVar51;
                    local_308._0_4_ = fVar48 / fVar51;
                    fStack_300 = fVar55;
                    fStack_2fc = fVar57;
                    local_278._4_4_ = fVar51;
                    local_278._0_4_ = fVar48 * (fVar48 / fVar51);
                    fStack_270 = fVar55;
                    fStack_26c = fVar57;
                  }
                  iVar44 = iVar44 + 1;
                } while (iVar44 != 0x10);
                local_318 = local_2c0;
                iVar44 = 0;
                iVar54 = 0;
                iVar56 = 0;
                iVar58 = 0;
                lVar38 = 0;
                do {
                  auVar59 = ZEXT415(*(uint *)((long)&local_318 + lVar38)) ^ auVar71._0_15_;
                  auVar13[0xd] = 0;
                  auVar13._0_13_ = auVar59._0_13_;
                  auVar13[0xe] = auVar59[7];
                  auVar15[0xc] = auVar59[6];
                  auVar15._0_12_ = auVar59._0_12_;
                  auVar15._13_2_ = auVar13._13_2_;
                  auVar16[0xb] = 0;
                  auVar16._0_11_ = auVar59._0_11_;
                  auVar16._12_3_ = auVar15._12_3_;
                  auVar17[10] = auVar59[5];
                  auVar17._0_10_ = auVar59._0_10_;
                  auVar17._11_4_ = auVar16._11_4_;
                  auVar18[9] = 0;
                  auVar18._0_9_ = auVar59._0_9_;
                  auVar18._10_5_ = auVar17._10_5_;
                  auVar19[8] = auVar59[4];
                  auVar19._0_8_ = auVar59._0_8_;
                  auVar19._9_6_ = auVar18._9_6_;
                  auVar20._7_8_ = 0;
                  auVar20._0_7_ = auVar19._8_7_;
                  Var21 = CONCAT81(SUB158(auVar20 << 0x40,7),auVar59[3]);
                  auVar26._9_6_ = 0;
                  auVar26._0_9_ = Var21;
                  auVar22._1_10_ = SUB1510(auVar26 << 0x30,5);
                  auVar22[0] = auVar59[2];
                  auVar27._11_4_ = 0;
                  auVar27._0_11_ = auVar22;
                  auVar23._1_12_ = SUB1512(auVar27 << 0x20,3);
                  auVar23[0] = auVar59[1];
                  uVar36 = CONCAT11(0,auVar59[0]);
                  auVar59._2_13_ = auVar23;
                  auVar59._0_2_ = uVar36;
                  auVar14._10_2_ = 0;
                  auVar14._0_10_ = auVar59._0_10_;
                  auVar14._12_2_ = (short)Var21;
                  uVar28 = CONCAT42(auVar14._10_4_,auVar22._0_2_);
                  auVar24._6_8_ = 0;
                  auVar24._0_6_ = uVar28;
                  iVar44 = iVar44 + (uint)uVar36;
                  iVar54 = iVar54 + (int)CONCAT82(SUB148(auVar24 << 0x40,6),auVar23._0_2_);
                  iVar56 = iVar56 + (int)uVar28;
                  iVar58 = iVar58 + (auVar14._10_4_ >> 0x10);
                  lVar38 = lVar38 + 4;
                } while (lVar38 != 8);
                fVar74 = (float)local_308._0_4_;
                if ((iVar58 + iVar54 + iVar56 + iVar44 != 0) && (0.0 < (float)local_308._0_4_)) {
                  fVar74 = 1.0 / (float)local_308._0_4_;
                  pfVar33 = local_1b8;
                  pfVar40 = local_1b8 + 0x40;
                  L_00 = (int8_t *)&local_298;
                  lVar38 = 0;
                  fVar48 = fVar74;
                  fVar51 = fVar74;
                  fVar55 = fVar74;
                  fVar57 = (float)local_308._0_4_;
                  local_2f8 = fVar74;
                  fStack_2f4 = fVar74;
                  fStack_2f0 = fVar74;
                  fStack_2ec = fVar74;
                  do {
                    auVar76 = auVar82._0_12_;
                    if (*(char *)((long)&local_318 + lVar38) == '\0') {
                      fVar49 = (*pfVar33 * fVar74 + -1.0) * 0.5 + 12582912.0;
                      fVar53 = (pfVar33[1] * fVar48 + -1.0) * 0.5 + 12582912.0;
                      auVar67._0_8_ = CONCAT44(fVar53,fVar49) & 0x7fffff007fffff;
                      auVar67._8_4_ =
                           (uint)((pfVar33[2] * fVar51 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                      auVar67._12_4_ =
                           (uint)((pfVar33[3] * fVar55 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                      auVar61._0_4_ = -(uint)((int)((uint)fVar49 & 0x7fffff) < auVar63._0_4_);
                      auVar61._4_4_ = -(uint)((int)((uint)fVar53 & 0x7fffff) < auVar63._4_4_);
                      auVar61._8_4_ = -(uint)((int)auVar67._8_4_ < auVar63._8_4_);
                      auVar61._12_4_ = -(uint)((int)auVar67._12_4_ < auVar63._12_4_);
                      auVar72 = ~auVar61 & auVar63 | auVar67 & auVar61;
                      auVar68._0_4_ = -(uint)(auVar97._0_4_ < auVar72._0_4_);
                      auVar68._4_4_ = -(uint)(auVar97._4_4_ < auVar72._4_4_);
                      auVar68._8_4_ = -(uint)(auVar97._8_4_ < auVar72._8_4_);
                      auVar68._12_4_ = -(uint)(auVar97._12_4_ < auVar72._12_4_);
                      auVar72 = pshuflw(auVar72,auVar68 & auVar72,0xe8);
                      auVar72 = pshufhw(auVar72,auVar72,0xe8);
                      auVar69._0_8_ =
                           CONCAT26(auVar72._10_2_ * 0x200,
                                    CONCAT24(auVar72._8_2_ * 0x40,
                                             CONCAT22(auVar72._2_2_ * 8,auVar72._0_2_)));
                      auVar69._8_8_ = 0;
                      uVar50 = (undefined4)(auVar69._0_8_ >> 0x20);
                      auVar62._4_4_ = uVar50;
                      auVar62._0_4_ = uVar50;
                      auVar62._8_4_ = uVar50;
                      auVar62._12_4_ = uVar50;
                      uVar31 = piVar29[(ushort)(SUB162(auVar62 | auVar69,2) |
                                               SUB162(auVar62 | auVar69,0))];
                      if ((long)(int)uVar31 < 0) {
                        uVar31 = iq3_find_best_neighbour
                                           (local_320 + -(long)(int)uVar31,grid,pfVar33,pfVar40,
                                            fVar57,L_00);
                        auVar97 = _DAT_0014e740;
                        auVar63 = _DAT_0014e990;
                        auVar64 = _DAT_0014e710;
                        auVar71 = _DAT_0014e690;
                        fVar74 = local_2f8;
                        fVar48 = fStack_2f4;
                        fVar51 = fStack_2f0;
                        fVar55 = fStack_2ec;
                        fVar57 = (float)local_308._0_4_;
                      }
                      uVar1 = grid[uVar31];
                      uVar65 = (undefined1)(uVar1 >> 0x18);
                      auVar79[0xf] = uVar65;
                      auVar79[0xe] = uVar65;
                      uVar66 = (undefined1)(uVar1 >> 0x10);
                      uVar65 = (undefined1)(uVar1 >> 8);
                      auVar25[3] = uVar65;
                      auVar25[2] = uVar65;
                      auVar79._12_2_ = auVar76._6_2_;
                      auVar79._0_12_ = auVar76;
                      auVar78._12_4_ = auVar79._12_4_;
                      auVar78._0_10_ = auVar76._0_10_;
                      auVar78._10_2_ = (short)(CONCAT15(uVar66,CONCAT14(uVar66,uVar1)) >> 0x20);
                      auVar77._10_6_ = auVar78._10_6_;
                      auVar77._0_8_ = auVar76._0_8_;
                      auVar77._8_2_ = auVar76._4_2_;
                      auVar25._4_8_ = auVar77._8_8_;
                      auVar25._0_2_ = auVar76._2_2_;
                      auVar80._0_4_ = ((int)CONCAT11((char)uVar1,(char)uVar1) >> 8) + -1;
                      auVar80._4_4_ = (auVar25._0_4_ >> 0x18) + -1;
                      auVar80._8_4_ = (auVar77._8_4_ >> 0x18) + -1;
                      auVar80._12_4_ = (auVar78._12_4_ >> 0x18) + -1;
                      auVar72 = packssdw(auVar80,auVar80);
                      uVar36 = -(short)(auVar80._0_4_ >> 0x1f);
                      cVar2 = -(char)(auVar80._0_4_ >> 0x1f);
                      auVar81[1] = 0;
                      auVar81[0] = (uVar36 != 0) * (uVar36 < 0x100) * cVar2 - (0xff < uVar36);
                      uVar73 = -(short)(auVar80._4_4_ >> 0x1f);
                      cVar3 = -(char)(auVar80._4_4_ >> 0x1f);
                      auVar81[2] = (uVar73 != 0) * (uVar73 < 0x100) * cVar3 - (0xff < uVar73);
                      auVar81[3] = 0;
                      uVar83 = -(short)(auVar80._8_4_ >> 0x1f);
                      cVar4 = (char)(auVar80._8_4_ >> 0x1f);
                      auVar81[4] = (uVar83 != 0) * (uVar83 < 0x100) * -cVar4 - (0xff < uVar83);
                      auVar81[5] = 0;
                      sVar6 = (short)(auVar80._12_4_ >> 0x1f);
                      uVar84 = -sVar6;
                      cVar5 = (char)(auVar80._12_4_ >> 0x1f);
                      auVar81[6] = (uVar84 != 0) * (uVar84 < 0x100) * -cVar5 - (0xff < uVar84);
                      auVar81[7] = 0;
                      auVar81[8] = (uVar36 != 0) * (uVar36 < 0x100) * cVar2 - (0xff < uVar36);
                      auVar81[9] = 0;
                      auVar81[10] = (uVar73 != 0) * (uVar73 < 0x100) * cVar3 - (0xff < uVar73);
                      auVar81[0xb] = 0;
                      auVar81[0xc] = (uVar83 != 0) * (uVar83 < 0x100) * -cVar4 - (0xff < uVar83);
                      auVar81[0xd] = 0;
                      uVar36 = -sVar6;
                      auVar81[0xe] = (uVar36 != 0) * (uVar36 < 0x100) * -cVar5 - (0xff < uVar36);
                      auVar81[0xf] = 0;
                      auVar70 = auVar72 & auVar81;
                      auVar81 = auVar81 ^ auVar72;
                      uVar36 = (auVar81._0_2_ >> 1) + auVar70._0_2_;
                      uVar83 = (auVar81._2_2_ >> 1) + auVar70._2_2_;
                      uVar85 = (auVar81._4_2_ >> 1) + auVar70._4_2_;
                      uVar87 = (auVar81._6_2_ >> 1) + auVar70._6_2_;
                      uVar89 = (auVar81._8_2_ >> 1) + auVar70._8_2_;
                      uVar91 = (auVar81._10_2_ >> 1) + auVar70._10_2_;
                      uVar93 = (auVar81._12_2_ >> 1) + auVar70._12_2_;
                      uVar95 = (auVar81._14_2_ >> 1) + auVar70._14_2_;
                      uVar73 = uVar36 & 0xff;
                      uVar84 = uVar83 & 0xff;
                      uVar86 = uVar85 & 0xff;
                      uVar88 = uVar87 & 0xff;
                      uVar90 = uVar89 & 0xff;
                      uVar92 = uVar91 & 0xff;
                      uVar94 = uVar93 & 0xff;
                      uVar96 = uVar95 & 0xff;
                      cVar2 = (char)uVar36;
                      cVar3 = (char)uVar83;
                      cVar4 = (char)uVar85;
                      cVar5 = (char)uVar87;
                      auVar82._0_4_ =
                           CONCAT13((uVar88 != 0) * (uVar88 < 0x100) * cVar5 - (0xff < uVar88),
                                    CONCAT12((uVar86 != 0) * (uVar86 < 0x100) * cVar4 -
                                             (0xff < uVar86),
                                             CONCAT11((uVar84 != 0) * (uVar84 < 0x100) * cVar3 -
                                                      (0xff < uVar84),
                                                      (uVar73 != 0) * (uVar73 < 0x100) * cVar2 -
                                                      (0xff < uVar73))));
                      cVar9 = (char)uVar89;
                      auVar82[4] = (uVar90 != 0) * (uVar90 < 0x100) * cVar9 - (0xff < uVar90);
                      cVar10 = (char)uVar91;
                      auVar82[5] = (uVar92 != 0) * (uVar92 < 0x100) * cVar10 - (0xff < uVar92);
                      cVar11 = (char)uVar93;
                      auVar82[6] = (uVar94 != 0) * (uVar94 < 0x100) * cVar11 - (0xff < uVar94);
                      cVar12 = (char)uVar95;
                      auVar82[7] = (uVar96 != 0) * (uVar96 < 0x100) * cVar12 - (0xff < uVar96);
                      auVar82[8] = (uVar73 != 0) * (uVar73 < 0x100) * cVar2 - (0xff < uVar73);
                      auVar82[9] = (uVar84 != 0) * (uVar84 < 0x100) * cVar3 - (0xff < uVar84);
                      auVar82[10] = (uVar86 != 0) * (uVar86 < 0x100) * cVar4 - (0xff < uVar86);
                      auVar82[0xb] = (uVar88 != 0) * (uVar88 < 0x100) * cVar5 - (0xff < uVar88);
                      auVar82[0xc] = (uVar90 != 0) * (uVar90 < 0x100) * cVar9 - (0xff < uVar90);
                      auVar82[0xd] = (uVar92 != 0) * (uVar92 < 0x100) * cVar10 - (0xff < uVar92);
                      auVar82[0xe] = (uVar94 != 0) * (uVar94 < 0x100) * cVar11 - (0xff < uVar94);
                      auVar82[0xf] = (uVar96 != 0) * (uVar96 < 0x100) * cVar12 - (0xff < uVar96);
                      *(undefined4 *)L_00 = auVar82._0_4_;
                    }
                    lVar38 = lVar38 + 1;
                    L_00 = L_00 + 4;
                    pfVar40 = pfVar40 + 4;
                    pfVar33 = pfVar33 + 4;
                  } while (lVar38 != 8);
                  fVar74 = 0.0;
                  fVar48 = 0.0;
                  lVar38 = 0;
                  do {
                    fVar51 = (float)(*(char *)((long)&local_298 + lVar38) * 2 + 1);
                    fVar74 = fVar74 + fVar51 * fVar51 * local_1b8[lVar38 + 0x20];
                    fVar48 = fVar48 + fVar51 * local_1b8[lVar38] * local_1b8[lVar38 + 0x20];
                    lVar38 = lVar38 + 1;
                  } while (lVar38 != 0x20);
                  auVar82 = ZEXT416(uVar75);
                  n = local_2a8;
                  fVar74 = (float)(~-(uint)(0.0 < fVar74) & local_308._0_4_ |
                                  (uint)(fVar48 / fVar74) & -(uint)(0.0 < fVar74));
                }
                if (fVar74 < 0.0) {
                  local_348[0] = ~local_348[0] & 0x7f7f7f7f;
                  fVar74 = (float)((uint)fVar74 ^ (uint)DAT_0014a080);
                }
                pcVar39 = (char *)&local_298;
                lVar38 = 0;
                do {
                  lVar46 = 0;
                  uVar35 = 0;
                  pcVar37 = pcVar39;
                  do {
                    uVar35 = (ulong)((uint)uVar35 | (int)*pcVar37 << ((byte)lVar46 & 0x1f));
                    lVar46 = lVar46 + 3;
                    pcVar37 = pcVar37 + 1;
                  } while (lVar46 != 0xc);
                  if (piVar29[uVar35 & 0xffff] < 0) {
                    printf("Oops: found point %u not on grid:");
                    lVar38 = 4;
                    do {
                      printf(" %d",(ulong)(uint)(int)*pcVar39);
                      pcVar39 = pcVar39 + 1;
                      lVar38 = lVar38 + -1;
                    } while (lVar38 != 0);
                    putchar(10);
                    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c"
                               ,0xe8a,"fatal error");
                  }
                  *(char *)((long)local_248 + lVar38 + local_350 * 8) =
                       (char)piVar29[uVar35 & 0xffff];
                  lVar38 = lVar38 + 1;
                  pcVar39 = pcVar39 + 4;
                } while (lVar38 != 8);
                local_208[local_350] =
                     (local_348[0] >> 0x18) << 0x15 | (local_348[0] >> 0x10 & 0xff) << 0xe |
                     (local_348[0] >> 8 & 0xff) << 7 | local_348[0] & 0xff;
                if (fVar74 < 0.0) {
                  pcVar39 = "scale >= 0";
                  iVar44 = 0xe95;
                  goto LAB_00136c9d;
                }
                afStack_1d8[local_350] = fVar74;
                lVar46 = local_338;
                auVar72 = _DAT_0014a080;
                auVar70 = _DAT_0014e7c0;
                if (auVar82._0_4_ <= fVar74) {
                  auVar82._0_4_ = fVar74;
                }
              }
              else {
                afStack_1d8[local_350] = 0.0;
                local_298 = 0;
                uStack_290 = 0;
                local_288 = 0;
                uStack_280 = 0;
              }
              puVar30 = local_2c8;
              lVar38 = local_328;
              local_350 = local_350 + 1;
              local_340 = local_340 + 0x80;
              local_2b8 = local_2b8 + 0x80;
            } while (local_350 != 8);
            fVar74 = auVar82._0_4_;
            if ((fVar74 != 0.0) || (NAN(fVar74))) {
              fVar51 = (fVar74 / 31.0) * 1.0125;
              fVar48 = (float)(((uint)fVar51 & 0x7f800000) + 0x7800000);
              if ((uint)((int)fVar51 * 2) < 0x71000000) {
                fVar48 = 2.0;
              }
              fVar48 = fVar48 + ABS(fVar51) * 5.192297e+33 * 7.70372e-34;
              uVar36 = (SUB42(fVar48,0) & 0xfff) + ((ushort)((uint)fVar48 >> 0xd) & 0x7c00);
              if (0xff000000 < (uint)((int)fVar51 * 2)) {
                uVar36 = 0x7e00;
              }
              *(ushort *)local_2d0 = uVar36 | (ushort)((uint)fVar51 >> 0x10) & 0x8000;
              fVar74 = 1.0 / (fVar74 / 31.0);
              lVar32 = 0x10;
              do {
                fVar48 = (local_218[lVar32] * fVar74 + -1.0) * 0.5 + 12582912.0;
                fVar51 = (local_218[lVar32 + 1] * fVar74 + -1.0) * 0.5 + 12582912.0;
                auVar63._0_8_ = CONCAT44(fVar51,fVar48) & 0x7fffff007fffff;
                auVar63._8_4_ =
                     (uint)((local_218[lVar32 + 2] * fVar74 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                auVar63._12_4_ =
                     (uint)((local_218[lVar32 + 3] * fVar74 + -1.0) * 0.5 + 12582912.0) & 0x7fffff;
                auVar71._0_4_ = -(uint)((int)((uint)fVar48 & 0x7fffff) < auVar70._0_4_);
                auVar71._4_4_ = -(uint)((int)((uint)fVar51 & 0x7fffff) < auVar70._4_4_);
                auVar71._8_4_ = -(uint)((int)auVar63._8_4_ < auVar70._8_4_);
                auVar71._12_4_ = -(uint)((int)auVar63._12_4_ < auVar70._12_4_);
                auVar72 = ~auVar71 & auVar70 | auVar63 & auVar71;
                auVar64._0_4_ = -(uint)(auVar97._0_4_ < auVar72._0_4_);
                auVar64._4_4_ = -(uint)(auVar97._4_4_ < auVar72._4_4_);
                auVar64._8_4_ = -(uint)(auVar97._8_4_ < auVar72._8_4_);
                auVar64._12_4_ = -(uint)(auVar97._12_4_ < auVar72._12_4_);
                auVar64 = auVar64 & auVar72;
                local_248[lVar32] = auVar64._0_4_ << 0x1c | local_248[lVar32];
                local_248[lVar32 + 1] = auVar64._4_4_ << 0x1c | local_248[lVar32 + 1];
                local_248[lVar32 + 2] = auVar64._8_4_ << 0x1c | local_248[lVar32 + 2];
                local_248[lVar32 + 3] = auVar64._12_4_ << 0x1c | local_248[lVar32 + 3];
                lVar32 = lVar32 + 4;
              } while (lVar32 != 0x18);
              memcpy(local_2c8,local_248,0x60);
              auVar72 = _DAT_0014a080;
              auVar70 = _DAT_0014e7c0;
              auVar97 = _DAT_0014e740;
              auVar63 = _DAT_0014e990;
              auVar64 = _DAT_0014e710;
              auVar71 = _DAT_0014e690;
            }
            else {
              local_2c8[10] = 0;
              local_2c8[0xb] = 0;
              local_2c8[8] = 0;
              local_2c8[9] = 0;
              local_2c8[6] = 0;
              local_2c8[7] = 0;
              local_2c8[4] = 0;
              local_2c8[5] = 0;
              local_2c8[2] = 0;
              local_2c8[3] = 0;
              *local_2c8 = 0;
              local_2c8[1] = 0;
            }
            x = (float *)((long)local_2d0 + 0x62);
            local_2c8 = (undefined8 *)((long)puVar30 + 0x62);
            local_328 = lVar38 + 1;
            lVar38 = local_330 + 0x400;
            local_2d8 = local_2d8 + 0x400;
          } while (local_328 != lVar46);
        }
        return;
      }
      pcVar39 = "n%QK_K == 0";
      iVar44 = 0xde9;
    }
  }
LAB_00136c9d:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c",
             iVar44,"GGML_ASSERT(%s) failed",pcVar39);
}

Assistant:

static void quantize_row_iq3_xxs_impl(int grid_size, const float * GGML_RESTRICT x, void * GGML_RESTRICT vy, int64_t n,
        const float * GGML_RESTRICT quant_weights) {

    const int gindex = iq3_data_index(grid_size);

    const uint32_t * kgrid_q3xs      = iq3_data[gindex].grid;
    const int      * kmap_q3xs       = iq3_data[gindex].map;
    const uint16_t * kneighbors_q3xs = iq3_data[gindex].neighbours;

    //GGML_ASSERT(quant_weights   && "missing quantization weights");
    GGML_ASSERT(kgrid_q3xs      && "forgot to call ggml_quantize_init()?");
    GGML_ASSERT(kmap_q3xs       && "forgot to call ggml_quantize_init()?");
    GGML_ASSERT(kneighbors_q3xs && "forgot to call ggml_quantize_init()?");
    GGML_ASSERT(n%QK_K == 0);

    const int kMaxQ = 8;

    const int64_t nbl = n/QK_K;

    ggml_fp16_t * dh;
    uint8_t * qs;
    int block_size;
    if (grid_size == 256) {
        block_iq3_xxs * y = vy;
        dh = &y->d;
        qs = y->qs;
        block_size = sizeof(block_iq3_xxs);
    } else {
        block_iq3_s * y = vy;
        dh = &y->d;
        qs = y->qs;
        block_size = sizeof(block_iq3_s);
    }
    int quant_size = block_size - sizeof(ggml_fp16_t);

    float scales[QK_K/32];
    float weight[32];
    float xval[32];
    int8_t L[32];
    int8_t Laux[32];
    float  waux[32];
    bool   is_on_grid[8];
    bool   is_on_grid_aux[8];
    uint8_t block_signs[8];
    uint8_t q3[3*(QK_K/8)+QK_K/32];
    uint32_t * scales_and_signs = (uint32_t *)(q3 + QK_K/4);
    uint8_t  * qh = q3 + 3*(QK_K/8);

    for (int ibl = 0; ibl < nbl; ++ibl) {

        dh[0] = GGML_FP32_TO_FP16(0.f);
        memset(q3, 0, 3*QK_K/8+QK_K/32);

        float max_scale = 0;

        const float * xbl = x + QK_K*ibl;
        float sumx2 = 0;
        for (int i = 0; i < QK_K; ++i) sumx2 += xbl[i]*xbl[i];
        float sigma2 = 2*sumx2/QK_K;

        for (int ib = 0; ib < QK_K/32; ++ib) {
            const float * xb = xbl + 32*ib;
            if (quant_weights) {
                const float * qw = quant_weights + QK_K*ibl + 32*ib;
                for (int i = 0; i < 32; ++i) weight[i] = qw[i] * sqrtf(sigma2 + xb[i]*xb[i]);
            } else {
                for (int i = 0; i < 32; ++i) weight[i] = xb[i]*xb[i];
            }
            for (int i = 0; i < 32; ++i) waux[i] = sqrtf(weight[i]);
            for (int k = 0; k < 4; ++k) {
                int nflip = 0;
                uint8_t s = 0;
                for (int i = 0; i < 8; ++i) {
                    if (xb[8*k + i] >= 0) xval[8*k + i] = xb[8*k + i];
                    else {
                        xval[8*k + i] = -xb[8*k + i]; ++nflip; s |= (1 << i);
                    }
                }
                if (nflip%2) {
                    int imin = 0; float min = weight[8*k+imin]*xb[8*k+imin]*xb[8*k+imin];
                    for (int i = 1; i < 8; ++i) {
                        float ax = weight[8*k+i]*xb[8*k+i]*xb[8*k+i];
                        if (ax < min) {
                            min = ax; imin = i;
                        }
                    }
                    xval[8*k+imin] = -xval[8*k+imin];
                    s ^= (1 << imin);
                }
                block_signs[k] = s & 127;
            }
            float max = xval[0];
            for (int i = 1; i < 32; ++i) max = MAX(max, xval[i]);
            if (max < GROUP_MAX_EPS_IQ3_XXS) {
                scales[ib] = 0;
                memset(L, 0, 32);
                continue;
            }
            float best = 0;
            float scale = max/(2*kMaxQ-1);
            for (int is = -15; is <= 15; ++is) {
                float id = (2*kMaxQ-1+is*0.2f)/max;
                float this_scale = 1/id;
                for (int k = 0; k < 8; ++k) {
                    for (int i = 0; i < 4; ++i) {
                        int l = nearest_int(0.5f*(id*xval[4*k+i]-1));
                        Laux[4*k+i] = MAX(0, MIN(kMaxQ-1, l));
                    }
                    uint16_t u = 0;
                    for (int i = 0; i < 4; ++i) u |= (Laux[4*k+i] << 3*i);
                    int grid_index = kmap_q3xs[u];
                    is_on_grid_aux[k] = true;
                    if (grid_index < 0) {
                        is_on_grid_aux[k] = false;
                        const uint16_t * neighbours = kneighbors_q3xs - kmap_q3xs[u] - 1;
                        grid_index = iq3_find_best_neighbour(neighbours, kgrid_q3xs, xval + 4*k, waux + 4*k, this_scale, Laux + 4*k);
                    }
                }
                float sumqx = 0, sumq2 = 0;
                for (int i = 0; i < 32; ++i) {
                    float w = weight[i];
                    float q = 2*Laux[i] + 1;
                    sumqx += w*xval[i]*q;
                    sumq2 += w*q*q;
                }
                if (sumq2 > 0 && sumqx*sumqx > best*sumq2) {
                    scale = sumqx/sumq2; best = scale*sumqx;
                    for (int i = 0; i < 32; ++i) L[i] = Laux[i];
                    for (int k = 0; k <  8; ++k) is_on_grid[k] = is_on_grid_aux[k];
                }
            }
            int n_not_ongrid = 0;
            for (int k = 0; k < 8; ++k) if (!is_on_grid[k]) ++n_not_ongrid;
            if (n_not_ongrid > 0 && scale > 0) {
                float id = 1/scale;
                for (int k = 0; k < 8; ++k) {
                    if (is_on_grid[k]) continue;
                    uint16_t u = 0;
                    for (int i = 0; i < 4; ++i) {
                        int l = nearest_int(0.5f*(id*xval[4*k+i]-1));
                        l = MAX(0, MIN(kMaxQ-1, l));
                        u |= (l << 3*i);
                    }
                    int grid_index = kmap_q3xs[u];
                    if (grid_index < 0) {
                        const uint16_t * neighbours = kneighbors_q3xs - kmap_q3xs[u] - 1;
                        grid_index = iq3_find_best_neighbour(neighbours, kgrid_q3xs, xval + 4*k, waux + 4*k, scale, L + 4*k);
                    }
                    const int8_t * pg = (const int8_t *)(kgrid_q3xs + grid_index);
                    for (int i = 0; i < 4; ++i) L[4*k+i] = (pg[i] - 1)/2;
                }
                float sumqx = 0, sumq2 = 0;
                for (int i = 0; i < 32; ++i) {
                    float w = weight[i];
                    float q = 2*L[i] + 1;
                    sumqx += w*xval[i]*q;
                    sumq2 += w*q*q;
                }
                if (sumq2 > 0) scale = sumqx/sumq2;
            }
            if (scale < 0) {
                // This should never happen, but just in case, flip scale so that it is positive (we use uint's to encode the scale)
                // and correspondingly flip quant signs.
                scale = -scale;
                for (int k = 0; k < 4; ++k) block_signs[k] = (~block_signs[k]) & 127;
            }
            for (int k = 0; k < 8; ++k) {
                uint16_t u = 0;
                for (int i = 0; i < 4; ++i) u |= (L[4*k+i] << 3*i);
                int grid_index = kmap_q3xs[u];
                if (grid_index < 0) {
                    printf("Oops: found point %u not on grid:", u);
                    for (int i = 0; i < 4; ++i) printf(" %d", L[4*k+i]);
                    printf("\n");
                    GGML_ABORT("fatal error");
                }
                if (grid_size == 256) {
                    q3[8*ib+k] = grid_index;
                } else {
                    q3[8*ib+k] = grid_index & 255;
                    qh[ib] |= ((grid_index >> 8) << k);
                }

            }
            scales_and_signs[ib] = block_signs[0] | (block_signs[1] << 7) | (block_signs[2] << 14) | (block_signs[3] << 21);
            GGML_ASSERT(scale >= 0);
            scales[ib] = scale;
            max_scale = MAX(max_scale, scale);
        }

        if (!max_scale) {
            memset(qs, 0, quant_size);
            dh += block_size/sizeof(ggml_fp16_t);
            qs += block_size;
            continue;
        }

        float d = max_scale/31;
        dh[0] = GGML_FP32_TO_FP16(d * 1.0125f);  // small improvement via this fudge factor
        float id = 1/d;
        for (int ib = 0; ib < QK_K/32; ++ib) {
            int l = nearest_int(0.5f*(id*scales[ib]-1));
            l = MAX(0, MIN(15, l));
            scales_and_signs[ib] |= ((uint32_t)l << 28);
        }
        memcpy(qs, q3, quant_size);

        dh += block_size/sizeof(ggml_fp16_t);
        qs += block_size;

    }
}